

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O3

zip_int64_t read_data(void *state,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  undefined8 uVar1;
  long *plVar2;
  buffer_t *buffer;
  _Bool _Var3;
  int iVar4;
  zip_uint8_t *pzVar5;
  long lVar6;
  zip_int64_t zVar7;
  zip_uint64_t zVar8;
  ulong uVar9;
  zip_uint64_t zVar10;
  buffer_t *pbVar11;
  zip_uint64_t *pzVar12;
  zip_buffer_fragment_t *pzVar13;
  int se;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  zip_uint64_t zVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  size_t __n;
  long lVar21;
  bool bVar22;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    pbVar11 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010e9ec;
  case ZIP_SOURCE_READ:
    if (-1 < (long)len) {
      plVar2 = *(long **)((long)state + 0x30);
      uVar15 = plVar2[7] - plVar2[8];
      if (len <= uVar15) {
        uVar15 = len;
      }
      if (uVar15 == 0) {
        return 0;
      }
      lVar19 = plVar2[9];
      lVar6 = *plVar2;
      lVar16 = plVar2[8] - *(long *)(plVar2[1] + lVar19 * 8);
      uVar9 = 0;
      do {
        lVar21 = lVar19 * 0x10;
        uVar18 = *(long *)(lVar6 + 8 + lVar21) - lVar16;
        if (uVar15 - uVar9 < uVar18) {
          uVar18 = uVar15 - uVar9;
        }
        memcpy((void *)((long)data + uVar9),(void *)(*(long *)(lVar6 + lVar21) + lVar16),uVar18);
        lVar6 = *plVar2;
        lVar19 = (ulong)(uVar18 == *(long *)(lVar6 + 8 + lVar21) - lVar16) + lVar19;
        uVar9 = uVar18 + uVar9;
        lVar16 = 0;
      } while (uVar9 < uVar15);
      plVar2[8] = plVar2[8] + uVar9;
      plVar2[9] = lVar19;
      return uVar9;
    }
    goto LAB_0010ea02;
  case ZIP_SOURCE_CLOSE:
    break;
  case ZIP_SOURCE_STAT:
    if (0x3f < len) {
      zip_stat_init((zip_stat_t *)data);
      *(undefined8 *)((long)data + 0x28) = *(undefined8 *)((long)state + 0x10);
      uVar1 = *(undefined8 *)(*(long *)((long)state + 0x30) + 0x38);
      *(undefined8 *)((long)data + 0x18) = uVar1;
      *(undefined8 *)((long)data + 0x20) = uVar1;
      *(undefined4 *)((long)data + 0x34) = 0;
      *(undefined8 *)data = 0xdc;
      return 0x40;
    }
    goto LAB_0010ea02;
  case ZIP_SOURCE_ERROR:
    zVar7 = zip_error_to_data((zip_error_t *)state,data,len);
    return zVar7;
  case ZIP_SOURCE_FREE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    buffer_free(*(buffer_t **)((long)state + 0x38));
    free(state);
    break;
  case ZIP_SOURCE_SEEK:
    pbVar11 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010e90e;
  case ZIP_SOURCE_TELL:
    lVar19 = *(long *)((long)state + 0x30);
    goto LAB_0010e928;
  case ZIP_SOURCE_BEGIN_WRITE:
    pbVar11 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    *(buffer_t **)((long)state + 0x38) = pbVar11;
    if (pbVar11 == (buffer_t *)0x0) {
      return -1;
    }
LAB_0010e9ec:
    pbVar11->offset = 0;
    pbVar11->current_fragment = 0;
    break;
  case ZIP_SOURCE_COMMIT_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)state + 0x38);
    goto LAB_0010e9cb;
  case ZIP_SOURCE_ROLLBACK_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x38));
LAB_0010e9cb:
    *(undefined8 *)((long)state + 0x38) = 0;
    break;
  case ZIP_SOURCE_WRITE:
    if (-1 < (long)len) {
      pbVar11 = *(buffer_t **)((long)state + 0x38);
      if (len <= -pbVar11->offset - 0x10000) {
        uVar18 = pbVar11->offset + len;
        pzVar12 = pbVar11->fragment_offsets;
        uVar9 = pbVar11->nfragments;
        uVar15 = pzVar12[uVar9];
        lVar19 = uVar18 - uVar15;
        if (uVar18 < uVar15 || lVar19 == 0) goto LAB_0010eae0;
        uVar20 = (lVar19 + 0xffffU >> 0x10) + uVar9;
        uVar18 = pbVar11->fragments_capacity;
        if (uVar18 < uVar20) {
          uVar9 = 0x10;
          if (uVar18 != 0) {
            uVar9 = uVar18;
          }
          do {
            uVar18 = uVar9;
            uVar9 = uVar18 * 2;
          } while (uVar18 < uVar20);
          _Var3 = buffer_grow_fragments(pbVar11,uVar18,(zip_error_t *)state);
          if (!_Var3) {
LAB_0010eacf:
            iVar4 = 0xe;
            goto LAB_0010ea0a;
          }
          uVar9 = pbVar11->nfragments;
        }
        if (uVar9 < uVar20) {
          pzVar13 = pbVar11->fragments;
          do {
            uVar15 = uVar15 + 0x10000;
            pzVar5 = (zip_uint8_t *)malloc(0x10000);
            pzVar13[uVar9].data = pzVar5;
            if (pzVar5 == (zip_uint8_t *)0x0) goto LAB_0010eacf;
            pzVar13[uVar9].length = 0x10000;
            pbVar11->nfragments = uVar9 + 1;
            pzVar12 = pbVar11->fragment_offsets;
            pzVar12[uVar9 + 1] = uVar15;
            uVar9 = pbVar11->nfragments;
          } while (uVar9 < uVar20);
        }
        else {
          pzVar12 = pbVar11->fragment_offsets;
        }
LAB_0010eae0:
        zVar8 = pbVar11->offset;
        zVar17 = pbVar11->current_fragment;
        if (len == 0) {
          uVar15 = 0;
        }
        else {
          lVar19 = zVar8 - pzVar12[zVar17];
          pzVar13 = pbVar11->fragments;
          uVar15 = 0;
          do {
            uVar9 = len - uVar15;
            uVar18 = pzVar13[zVar17].length - lVar19;
            __n = uVar18;
            if (uVar9 < uVar18) {
              __n = uVar9;
            }
            if ((uVar18 & uVar9) == 0xffffffffffffffff) {
              __n = 0xffffffffffffffff;
            }
            memcpy(pzVar13[zVar17].data + lVar19,(void *)((long)data + uVar15),__n);
            pzVar13 = pbVar11->fragments;
            sVar14 = pzVar13[zVar17].length - lVar19;
            lVar19 = lVar19 + __n;
            bVar22 = __n == sVar14;
            if (bVar22) {
              lVar19 = 0;
            }
            zVar17 = bVar22 + zVar17;
            uVar15 = __n + uVar15;
          } while (uVar15 < len);
          zVar8 = pbVar11->offset;
        }
        uVar9 = zVar8 + uVar15;
        pbVar11->offset = uVar9;
        pbVar11->current_fragment = zVar17;
        if (pbVar11->size < uVar9) {
          pbVar11->size = uVar9;
          return uVar15;
        }
        return uVar15;
      }
    }
    goto LAB_0010ea02;
  case ZIP_SOURCE_SEEK_WRITE:
    pbVar11 = *(buffer_t **)((long)state + 0x38);
LAB_0010e90e:
    iVar4 = buffer_seek(pbVar11,data,len,(zip_error_t *)state);
    return (long)iVar4;
  case ZIP_SOURCE_TELL_WRITE:
    lVar19 = *(long *)((long)state + 0x38);
LAB_0010e928:
    if (-1 < *(long *)(lVar19 + 0x40)) {
      return *(long *)(lVar19 + 0x40);
    }
    iVar4 = 0x1e;
    se = 0x4b;
    goto LAB_0010ea0c;
  case ZIP_SOURCE_SUPPORTS:
    zVar7 = zip_source_make_command_bitmap
                      (ZIP_SOURCE_GET_FILE_ATTRIBUTES,0,1,2,3,4,5,6,7,8,0x11,9,0xf,10,0xc,0xd,0xb,
                       0x14,0xffffffffffffffff);
    return zVar7;
  case ZIP_SOURCE_REMOVE:
    pbVar11 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    if (pbVar11 == (buffer_t *)0x0) {
      return -1;
    }
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(buffer_t **)((long)state + 0x30) = pbVar11;
    break;
  default:
    iVar4 = 0x1c;
    goto LAB_0010ea0a;
  case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    if (len == 0) {
      pbVar11 = buffer_new((zip_buffer_fragment_t *)0x0,0,1,(zip_error_t *)state);
      *(buffer_t **)((long)state + 0x38) = pbVar11;
      if (pbVar11 == (buffer_t *)0x0) {
        return -1;
      }
      uVar15 = pbVar11->nfragments;
LAB_0010eac2:
      pbVar11->offset = len;
      pbVar11->current_fragment = uVar15;
      return 0;
    }
    buffer = *(buffer_t **)((long)state + 0x30);
    iVar4 = 0x12;
    if ((len <= buffer->size) && (iVar4 = 0x1d, buffer->shared_buffer == (buffer *)0x0)) {
      zVar8 = buffer_find_fragment(buffer,len);
      pzVar13 = buffer->fragments;
      zVar17 = len - buffer->fragment_offsets[zVar8];
      if (zVar17 == 0) {
        zVar8 = zVar8 - 1;
        zVar10 = pzVar13[zVar8].length;
        zVar17 = zVar10;
      }
      else {
        zVar10 = pzVar13[zVar8].length;
      }
      iVar4 = 0x1c;
      if (zVar10 - zVar17 <= len) {
        zVar10 = zVar8 + 1;
        pbVar11 = buffer_new(pzVar13,zVar10,0,(zip_error_t *)state);
        if (pbVar11 != (buffer_t *)0x0) {
          pbVar11->fragments[zVar8].length = zVar17;
          pbVar11->fragment_offsets[pbVar11->nfragments] = len;
          pbVar11->size = len;
          uVar15 = pbVar11->nfragments;
          uVar9 = buffer->first_owned_fragment;
          if (uVar15 <= buffer->first_owned_fragment) {
            uVar9 = uVar15;
          }
          pbVar11->first_owned_fragment = uVar9;
          buffer->shared_buffer = pbVar11;
          pbVar11->shared_buffer = buffer;
          buffer->shared_fragments = zVar10;
          pbVar11->shared_fragments = zVar10;
          *(buffer_t **)((long)state + 0x38) = pbVar11;
          goto LAB_0010eac2;
        }
        goto LAB_0010ebc2;
      }
    }
    zip_error_set((zip_error_t *)state,iVar4,0);
LAB_0010ebc2:
    *(undefined8 *)((long)state + 0x38) = 0;
    return -1;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (0x17 < len) {
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)state + 0x28);
      uVar1 = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)data = *(undefined8 *)((long)state + 0x18);
      *(undefined8 *)((long)data + 8) = uVar1;
      return 0x18;
    }
LAB_0010ea02:
    iVar4 = 0x12;
LAB_0010ea0a:
    se = 0;
LAB_0010ea0c:
    zip_error_set((zip_error_t *)state,iVar4,se);
    return -1;
  }
  return 0;
}

Assistant:

static zip_int64_t
read_data(void *state, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct read_data *ctx = (struct read_data *)state;

    switch (cmd) {
    case ZIP_SOURCE_BEGIN_WRITE:
        if ((ctx->out = buffer_new(NULL, 0, 0, &ctx->error)) == NULL) {
            return -1;
        }
        ctx->out->offset = 0;
        ctx->out->current_fragment = 0;
        return 0;

    case ZIP_SOURCE_BEGIN_WRITE_CLONING:
        if ((ctx->out = buffer_clone(ctx->in, len, &ctx->error)) == NULL) {
            return -1;
        }
        ctx->out->offset = len;
        ctx->out->current_fragment = ctx->out->nfragments;
        return 0;

    case ZIP_SOURCE_CLOSE:
        return 0;

    case ZIP_SOURCE_COMMIT_WRITE:
        buffer_free(ctx->in);
        ctx->in = ctx->out;
        ctx->out = NULL;
        return 0;

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
        buffer_free(ctx->in);
        buffer_free(ctx->out);
        free(ctx);
        return 0;

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES: {
        if (len < sizeof(ctx->attributes)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }

        (void)memcpy_s(data, sizeof(ctx->attributes), &ctx->attributes, sizeof(ctx->attributes));

        return sizeof(ctx->attributes);
    }

    case ZIP_SOURCE_OPEN:
        ctx->in->offset = 0;
        ctx->in->current_fragment = 0;
        return 0;

    case ZIP_SOURCE_READ:
        if (len > ZIP_INT64_MAX) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        return buffer_read(ctx->in, data, len);

    case ZIP_SOURCE_REMOVE: {
        buffer_t *empty = buffer_new(NULL, 0, 0, &ctx->error);
        if (empty == NULL) {
            return -1;
        }

        buffer_free(ctx->in);
        ctx->in = empty;
        return 0;
    }

    case ZIP_SOURCE_ROLLBACK_WRITE:
        buffer_free(ctx->out);
        ctx->out = NULL;
        return 0;

    case ZIP_SOURCE_SEEK:
        return buffer_seek(ctx->in, data, len, &ctx->error);

    case ZIP_SOURCE_SEEK_WRITE:
        return buffer_seek(ctx->out, data, len, &ctx->error);

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        if (len < sizeof(*st)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }

        st = (zip_stat_t *)data;

        zip_stat_init(st);
        st->mtime = ctx->mtime;
        st->size = ctx->in->size;
        st->comp_size = st->size;
        st->comp_method = ZIP_CM_STORE;
        st->encryption_method = ZIP_EM_NONE;
        st->valid = ZIP_STAT_MTIME | ZIP_STAT_SIZE | ZIP_STAT_COMP_SIZE | ZIP_STAT_COMP_METHOD | ZIP_STAT_ENCRYPTION_METHOD;

        return sizeof(*st);
    }

    case ZIP_SOURCE_SUPPORTS:
        return zip_source_make_command_bitmap(ZIP_SOURCE_GET_FILE_ATTRIBUTES, ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_SEEK, ZIP_SOURCE_TELL, ZIP_SOURCE_BEGIN_WRITE, ZIP_SOURCE_BEGIN_WRITE_CLONING, ZIP_SOURCE_COMMIT_WRITE, ZIP_SOURCE_REMOVE, ZIP_SOURCE_ROLLBACK_WRITE, ZIP_SOURCE_SEEK_WRITE, ZIP_SOURCE_TELL_WRITE, ZIP_SOURCE_WRITE, ZIP_SOURCE_SUPPORTS_REOPEN, -1);

    case ZIP_SOURCE_TELL:
        if (ctx->in->offset > ZIP_INT64_MAX) {
            zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
            return -1;
        }
        return (zip_int64_t)ctx->in->offset;


    case ZIP_SOURCE_TELL_WRITE:
        if (ctx->out->offset > ZIP_INT64_MAX) {
            zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
            return -1;
        }
        return (zip_int64_t)ctx->out->offset;

    case ZIP_SOURCE_WRITE:
        if (len > ZIP_INT64_MAX) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        return buffer_write(ctx->out, data, len, &ctx->error);

    default:
        zip_error_set(&ctx->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;
    }
}